

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transform.cc
# Opt level: O0

void __thiscall pass_zero_input_port1_Test::TestBody(pass_zero_input_port1_Test *this)

{
  undefined1 auVar1 [8];
  bool bVar2;
  int iVar3;
  Generator *pGVar4;
  Port *pPVar5;
  undefined4 extraout_var;
  element_type *peVar6;
  char *pcVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  AssertHelper local_3e0;
  Message local_3d8 [6];
  exception *e_1;
  TrueWithString gtest_msg_1;
  AssertHelper local_380;
  Message local_378 [2];
  StmtException *anon_var_0;
  type e;
  undefined1 auStack_338 [7];
  bool gtest_caught_expected;
  TrueWithString gtest_msg;
  shared_ptr<kratos::Attribute> attr;
  shared_ptr<kratos::Stmt> local_2f8;
  undefined1 local_2e8 [32];
  enable_shared_from_this<kratos::Generator> local_2c8;
  allocator<char> local_2b1;
  string local_2b0;
  allocator<char> local_289;
  string local_288;
  Port *local_268;
  Port *out2;
  string local_258;
  Port *local_238;
  Port *in2;
  string local_228;
  Generator *local_208;
  Generator *mod2;
  undefined1 local_1f0 [39];
  allocator<char> local_1c9;
  string local_1c8;
  __node_base local_1a8;
  Port *out1;
  string local_198;
  Port *local_178;
  Port *in1;
  allocator<char> local_159;
  string local_158;
  undefined1 local_138 [8];
  Generator *mod1;
  Context c;
  pass_zero_input_port1_Test *this_local;
  
  c.tracked_generators_._M_h._M_single_bucket = (__node_base_ptr)this;
  kratos::Context::Context((Context *)&mod1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"module1",&local_159);
  pGVar4 = kratos::Context::generator((Context *)&mod1,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  local_138 = (undefined1  [8])pGVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"in",(allocator<char> *)((long)&out1 + 7));
  pPVar5 = kratos::Generator::port(pGVar4,In,&local_198,2);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator((allocator<char> *)((long)&out1 + 7));
  auVar1 = local_138;
  local_178 = pPVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"out",&local_1c9);
  pPVar5 = kratos::Generator::port((Generator *)auVar1,Out,&local_1c8,2);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  auVar1 = local_138;
  local_1a8._M_nxt = (_Hash_node_base *)pPVar5;
  std::enable_shared_from_this<kratos::Var>::shared_from_this
            ((enable_shared_from_this<kratos::Var> *)&mod2);
  kratos::Var::assign((Var *)local_1f0,(shared_ptr<kratos::Var> *)pPVar5);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
            ((shared_ptr<kratos::Stmt> *)(local_1f0 + 0x10),
             (shared_ptr<kratos::AssignStmt> *)local_1f0);
  kratos::Generator::add_stmt((Generator *)auVar1,(shared_ptr<kratos::Stmt> *)(local_1f0 + 0x10));
  std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)(local_1f0 + 0x10));
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_1f0);
  std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)&mod2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_228,"module2",(allocator<char> *)((long)&in2 + 7));
  pGVar4 = kratos::Context::generator((Context *)&mod1,&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator((allocator<char> *)((long)&in2 + 7));
  local_208 = pGVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"in",(allocator<char> *)((long)&out2 + 7));
  pPVar5 = kratos::Generator::port(pGVar4,In,&local_258,1);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator((allocator<char> *)((long)&out2 + 7));
  pGVar4 = local_208;
  local_238 = pPVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,"out",&local_289);
  pPVar5 = kratos::Generator::port(pGVar4,Out,&local_288,2);
  std::__cxx11::string::~string((string *)&local_288);
  std::allocator<char>::~allocator(&local_289);
  pGVar4 = local_208;
  local_268 = pPVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,"mod",&local_2b1);
  std::enable_shared_from_this<kratos::Generator>::shared_from_this(&local_2c8);
  kratos::Generator::add_child_generator
            (pGVar4,&local_2b0,(shared_ptr<kratos::Generator> *)&local_2c8);
  std::shared_ptr<kratos::Generator>::~shared_ptr((shared_ptr<kratos::Generator> *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::allocator<char>::~allocator(&local_2b1);
  pGVar4 = local_208;
  iVar3 = (*(local_178->super_Var).super_IRNode._vptr_IRNode[9])(local_178,0);
  kratos::Var::assign((Var *)local_2e8,(Var *)CONCAT44(extraout_var,iVar3));
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
            ((shared_ptr<kratos::Stmt> *)(local_2e8 + 0x10),
             (shared_ptr<kratos::AssignStmt> *)local_2e8);
  kratos::Generator::add_stmt(pGVar4,(shared_ptr<kratos::Stmt> *)(local_2e8 + 0x10));
  std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)(local_2e8 + 0x10));
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_2e8);
  pGVar4 = local_208;
  kratos::Var::assign((Var *)&attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount,&local_268->super_Var);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
            (&local_2f8,
             (shared_ptr<kratos::AssignStmt> *)
             &attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  kratos::Generator::add_stmt(pGVar4,&local_2f8);
  std::shared_ptr<kratos::Stmt>::~shared_ptr(&local_2f8);
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr
            ((shared_ptr<kratos::AssignStmt> *)
             &attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::make_shared<kratos::Attribute>();
  peVar6 = std::__shared_ptr_access<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)(gtest_msg.value.field_2._M_local_buf + 8));
  std::__cxx11::string::operator=((string *)&peVar6->type_str,"zero_inputs");
  kratos::IRNode::add_attribute
            (&local_208->super_IRNode,
             (shared_ptr<kratos::Attribute> *)((long)&gtest_msg.value.field_2 + 8));
  gtest_msg.value._M_string_length = 0;
  gtest_msg.value.field_2._M_allocated_capacity = 0;
  auStack_338[0] = (_Alloc_hider)0x0;
  stack0xfffffffffffffcc9 = 0;
  gtest_msg.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)auStack_338);
  bVar2 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)auStack_338);
  if (bVar2) {
    e._7_1_ = 0;
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      kratos::verify_generator_connectivity(local_208);
    }
    if ((e._7_1_ & 1) != 0) goto LAB_001399a2;
    std::__cxx11::string::operator=
              ((string *)auStack_338,
               "Expected: verify_generator_connectivity(&mod2) throws an exception of type StmtException.\n  Actual: it throws nothing."
              );
  }
  testing::Message::Message(local_378);
  pcVar7 = (char *)std::__cxx11::string::c_str();
  testing::internal::AssertHelper::AssertHelper
            (&local_380,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_transform.cc"
             ,0x2d,pcVar7);
  testing::internal::AssertHelper::operator=(&local_380,local_378);
  testing::internal::AssertHelper::~AssertHelper(&local_380);
  testing::Message::~Message(local_378);
LAB_001399a2:
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)auStack_338);
  kratos::zero_generator_inputs(local_208);
  gtest_msg_1.value._M_string_length = 0;
  gtest_msg_1.value.field_2._M_allocated_capacity = 0;
  e_1 = (exception *)0x0;
  gtest_msg_1.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg_1.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)&e_1);
  bVar2 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)&e_1);
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      kratos::verify_generator_connectivity(local_208);
    }
  }
  else {
    testing::Message::Message(local_3d8);
    std::operator+(&local_400,
                   "Expected: verify_generator_connectivity(&mod2) doesn\'t throw an exception.\n  Actual: "
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e_1);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_transform.cc"
               ,0x30,pcVar7);
    testing::internal::AssertHelper::operator=(&local_3e0,local_3d8);
    testing::internal::AssertHelper::~AssertHelper(&local_3e0);
    std::__cxx11::string::~string((string *)&local_400);
    testing::Message::~Message(local_3d8);
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)&e_1);
  std::shared_ptr<kratos::Attribute>::~shared_ptr
            ((shared_ptr<kratos::Attribute> *)((long)&gtest_msg.value.field_2 + 8));
  kratos::Context::~Context((Context *)&mod1);
  return;
}

Assistant:

TEST(pass, zero_input_port1) {  // NOLINT
    Context c;
    auto &mod1 = c.generator("module1");
    auto &in1 = mod1.port(PortDirection::In, "in", 2);
    auto &out1 = mod1.port(PortDirection::Out, "out", 2);
    mod1.add_stmt(out1.assign(in1.shared_from_this()));

    // the parent
    auto &mod2 = c.generator("module2");
    auto &in2 = mod2.port(PortDirection::In, "in", 1);
    auto &out2 = mod2.port(PortDirection::Out, "out", 2);
    mod2.add_child_generator("mod", mod1.shared_from_this());
    mod2.add_stmt(in1[0].assign(in2));
    mod2.add_stmt(out2.assign(out1));

    // add attribute
    auto attr = std::make_shared<Attribute>();
    attr->type_str = "zero_inputs";
    mod2.add_attribute(attr);

    // this one won't pass
    EXPECT_THROW(verify_generator_connectivity(&mod2), StmtException);
    // now fix the connections
    zero_generator_inputs(&mod2);
    EXPECT_NO_THROW(verify_generator_connectivity(&mod2));
}